

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::CodeGeneratorResponse_File
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  void *pvVar1;
  uint uVar2;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__CodeGeneratorResponse_File_00425ef0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((uVar2 & 1) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->name_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->name_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->insertion_point_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 2) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->insertion_point_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->insertion_point_).ptr_);
    uVar2 = (from->_has_bits_).has_bits_[0];
  }
  (this->content_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar2 & 4) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->content_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->content_).ptr_);
  }
  return;
}

Assistant:

CodeGeneratorResponse_File::CodeGeneratorResponse_File(const CodeGeneratorResponse_File& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  name_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_name()) {
    name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
  }
  insertion_point_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_insertion_point()) {
    insertion_point_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.insertion_point_);
  }
  content_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_content()) {
    content_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.content_);
  }
  // @@protoc_insertion_point(copy_constructor:google.protobuf.compiler.CodeGeneratorResponse.File)
}